

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O3

void amrex::Copy<amrex::EBCellFlagFab,void>
               (FabArray<amrex::EBCellFlagFab> *dst,FabArray<amrex::EBCellFlagFab> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Array4<amrex::EBCellFlag> dstFab;
  Array4<const_amrex::EBCellFlag> srcFab;
  MFIter mfi;
  Box local_194;
  ulong local_178;
  int local_170;
  int local_16c;
  IntVect *local_168;
  FabArray<amrex::EBCellFlagFab> *local_160;
  FabArray<amrex::EBCellFlagFab> *local_158;
  long local_150;
  long local_148;
  ulong local_140;
  long local_138;
  long local_130;
  ulong local_128;
  EBCellFlag *local_120;
  long local_118;
  Array4<amrex::EBCellFlag> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  local_160 = dst;
  local_158 = src;
  MFIter::MFIter(&local_90,&dst->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_148 = (long)srccomp;
    local_150 = (long)dstcomp;
    local_140 = (ulong)(uint)numcomp;
    local_168 = nghost;
    do {
      MFIter::growntilebox(&local_194,&local_90,nghost);
      if ((((local_194.smallend.vect[0] <= local_194.bigend.vect[0]) &&
           (local_194.smallend.vect[1] <= local_194.bigend.vect[1])) &&
          (local_194.smallend.vect[2] <= local_194.bigend.vect[2])) && (local_194.btype.itype < 8))
      {
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_d0,local_158,&local_90);
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_110,local_160,&local_90);
        nghost = local_168;
        if (0 < numcomp) {
          local_170 = local_194.smallend.vect[0];
          local_128 = (ulong)(uint)local_194.bigend.vect[0];
          local_16c = local_194.bigend.vect[0] + 1;
          local_178 = 0;
          do {
            if (local_194.smallend.vect[2] <= local_194.bigend.vect[2]) {
              local_130 = local_148 + local_178;
              local_138 = local_150 + local_178;
              iVar2 = local_194.smallend.vect[2];
              do {
                if (local_194.smallend.vect[1] <= local_194.bigend.vect[1]) {
                  local_118 = local_d0.nstride * local_130;
                  local_120 = local_110.p;
                  iVar3 = local_194.smallend.vect[1];
                  do {
                    iVar1 = local_194.smallend.vect[0];
                    if (local_194.smallend.vect[0] <= local_194.bigend.vect[0]) {
                      do {
                        local_110.p
                        [((long)iVar3 - (long)local_110.begin.y) * local_110.jstride +
                         (long)(iVar1 - local_110.begin.x) +
                         ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride +
                         local_110.nstride * local_138].flag =
                             local_d0.p
                             [((long)iVar3 - (long)local_d0.begin.y) * local_d0.jstride +
                              (long)(iVar1 - local_d0.begin.x) +
                              ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride + local_118]
                             .flag;
                        iVar1 = iVar1 + 1;
                      } while (local_16c != iVar1);
                    }
                    bVar4 = iVar3 != local_194.bigend.vect[1];
                    iVar3 = iVar3 + 1;
                  } while (bVar4);
                }
                bVar4 = iVar2 != local_194.bigend.vect[2];
                iVar2 = iVar2 + 1;
              } while (bVar4);
            }
            local_178 = local_178 + 1;
          } while (local_178 != local_140);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}